

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void udp_pipe_recv_cancel(nni_aio *aio,void *arg,int rv)

{
  int iVar1;
  nni_mtx *mtx;
  
  mtx = (nni_mtx *)(*arg + 8);
  nni_mtx_lock(mtx);
  iVar1 = nni_aio_list_active(aio);
  if (iVar1 != 0) {
    nni_aio_list_remove(aio);
    nni_mtx_unlock(mtx);
    nni_aio_finish_error(aio,rv);
    return;
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
udp_pipe_recv_cancel(nni_aio *aio, void *arg, int rv)
{
	udp_pipe *p  = arg;
	udp_ep   *ep = p->ep;

	nni_mtx_lock(&ep->mtx);
	if (!nni_aio_list_active(aio)) {
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	nni_aio_list_remove(aio);
	nni_mtx_unlock(&ep->mtx);
	nni_aio_finish_error(aio, rv);
}